

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemGetAddressRange(ze_context_handle_t hContext,void *ptr,void **pBase,size_t *pSize)

{
  ze_pfnMemGetAddressRange_t pfnGetAddressRange;
  ze_result_t result;
  size_t *pSize_local;
  void **pBase_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnGetAddressRange._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c510 != (code *)0x0) {
    pfnGetAddressRange._4_4_ = (*DAT_0011c510)(hContext,ptr,pBase,pSize);
  }
  return pfnGetAddressRange._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetAddressRange(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] memory pointer to query
        void** pBase,                                   ///< [in,out][optional] base address of the allocation
        size_t* pSize                                   ///< [in,out][optional] size of the allocation
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetAddressRange = context.zeDdiTable.Mem.pfnGetAddressRange;
        if( nullptr != pfnGetAddressRange )
        {
            result = pfnGetAddressRange( hContext, ptr, pBase, pSize );
        }
        else
        {
            // generic implementation
        }

        return result;
    }